

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_false>::parse_simple
                   (char_t *s,char_t end_quote)

{
  char_t *pcVar1;
  undefined1 local_30 [7];
  char_t ss;
  gap g;
  byte *pbStack_18;
  char_t end_quote_local;
  char_t *s_local;
  
  g.size._7_1_ = end_quote;
  gap::gap((gap *)local_30);
  pbStack_18 = (byte *)s;
  do {
    while (((anonymous_namespace)::chartype_table[*pbStack_18] & 2) != 0) {
LAB_0015c587:
      if (*pbStack_18 == g.size._7_1_) {
        pcVar1 = gap::flush((gap *)local_30,(char_t *)pbStack_18);
        *pcVar1 = '\0';
        return (char_t *)(pbStack_18 + 1);
      }
      if (*pbStack_18 == 0) {
        return (char_t *)0x0;
      }
      pbStack_18 = pbStack_18 + 1;
    }
    if (((anonymous_namespace)::chartype_table[pbStack_18[1]] & 2) != 0) {
      pbStack_18 = pbStack_18 + 1;
      goto LAB_0015c587;
    }
    if (((anonymous_namespace)::chartype_table[pbStack_18[2]] & 2) != 0) {
      pbStack_18 = pbStack_18 + 2;
      goto LAB_0015c587;
    }
    if (((anonymous_namespace)::chartype_table[pbStack_18[3]] & 2) != 0) {
      pbStack_18 = pbStack_18 + 3;
      goto LAB_0015c587;
    }
    pbStack_18 = pbStack_18 + 4;
  } while( true );
}

Assistant:

static char_t* parse_simple(char_t* s, char_t end_quote)
		{
			gap g;

			while (true)
			{
				PUGI__SCANWHILE_UNROLL(!PUGI__IS_CHARTYPE(ss, ct_parse_attr));

				if (*s == end_quote)
				{
					*g.flush(s) = 0;

					return s + 1;
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return 0;
				}
				else ++s;
			}
		}